

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O0

S1Interval __thiscall S1Interval::Intersection(S1Interval *this,S1Interval *y)

{
  S1Interval *this_00;
  bool bVar1;
  ostream *poVar2;
  double dVar3;
  double dVar4;
  S2LogMessage local_40;
  S2LogMessageVoidify local_29;
  S1Interval *local_28;
  S1Interval *y_local;
  S1Interval *this_local;
  
  local_28 = y;
  y_local = this;
  bVar1 = is_empty(y);
  if (bVar1) {
    _this_local = Empty();
  }
  else {
    dVar3 = lo(local_28);
    bVar1 = FastContains(this,dVar3);
    if (bVar1) {
      dVar3 = hi(local_28);
      bVar1 = FastContains(this,dVar3);
      if (bVar1) {
        dVar3 = GetLength(local_28);
        dVar4 = GetLength(this);
        if (dVar4 <= dVar3) {
          _this_local = *(S1Interval *)(this->bounds_).c_;
        }
        else {
          _this_local = *(Vector2_d *)(local_28->bounds_).c_;
        }
      }
      else {
        dVar3 = lo(local_28);
        dVar4 = hi(this);
        S1Interval((S1Interval *)&this_local,dVar3,dVar4,ARGS_CHECKED);
      }
    }
    else {
      dVar3 = hi(local_28);
      bVar1 = FastContains(this,dVar3);
      this_00 = local_28;
      if (bVar1) {
        dVar3 = lo(this);
        dVar4 = hi(local_28);
        S1Interval((S1Interval *)&this_local,dVar3,dVar4,ARGS_CHECKED);
      }
      else {
        dVar3 = lo(this);
        bVar1 = FastContains(this_00,dVar3);
        if (bVar1) {
          _this_local = *(S1Interval *)(this->bounds_).c_;
        }
        else {
          bVar1 = Intersects(this,local_28);
          if (bVar1) {
            S2FatalLogMessage::S2FatalLogMessage
                      ((S2FatalLogMessage *)&local_40,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.cc"
                       ,0x117,kFatal,(ostream *)&std::cerr);
            poVar2 = S2LogMessage::stream(&local_40);
            poVar2 = std::operator<<(poVar2,"Check failed: !Intersects(y) ");
            S2LogMessageVoidify::operator&(&local_29,poVar2);
            S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_40);
          }
          _this_local = Empty();
        }
      }
    }
  }
  return (Vector2_d)(Vector2_d)_this_local;
}

Assistant:

S1Interval S1Interval::Intersection(const S1Interval& y) const {
  // The y.is_full() case is handled correctly in all cases by the code
  // below, but can follow three separate code paths depending on whether
  // this interval is inverted, is non-inverted but contains Pi, or neither.

  if (y.is_empty()) return Empty();
  if (FastContains(y.lo())) {
    if (FastContains(y.hi())) {
      // Either this interval contains y, or the region of intersection
      // consists of two disjoint subintervals.  In either case, we want
      // to return the shorter of the two original intervals.
      if (y.GetLength() < GetLength()) return y;  // is_full() code path
      return *this;
    }
    return S1Interval(y.lo(), hi(), ARGS_CHECKED);
  }
  if (FastContains(y.hi())) return S1Interval(lo(), y.hi(), ARGS_CHECKED);

  // This interval contains neither endpoint of y.  This means that either y
  // contains all of this interval, or the two intervals are disjoint.

  if (y.FastContains(lo())) return *this;  // is_empty() okay here
  S2_DCHECK(!Intersects(y));
  return Empty();
}